

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

word Mpm_CutGetSign(Mpm_Cut_t *pCut)

{
  int iVar1;
  ulong local_20;
  word uSign;
  int iLeaf;
  int i;
  Mpm_Cut_t *pCut_local;
  
  local_20 = 0;
  for (uSign._4_4_ = 0; uSign._4_4_ < (int)(*(uint *)&pCut->field_0x4 >> 0x1b);
      uSign._4_4_ = uSign._4_4_ + 1) {
    iVar1 = Abc_Lit2Var(pCut->pLeaves[uSign._4_4_]);
    local_20 = 1L << ((byte)iVar1 & 0x3f) | local_20;
  }
  return local_20;
}

Assistant:

static inline word Mpm_CutGetSign( Mpm_Cut_t * pCut )  
{
    int i, iLeaf;
    word uSign = 0;
    Mpm_CutForEachLeafId( pCut, iLeaf, i )
        uSign |= ((word)1 << (iLeaf & 0x3F));
    return uSign;
}